

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O0

string * getCssClass_abi_cxx11_(string *__return_storage_ptr__,size_t totalTests,size_t passedTests)

{
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  size_t local_20;
  size_t passedTests_local;
  size_t totalTests_local;
  
  local_20 = passedTests;
  passedTests_local = totalTests;
  totalTests_local = (size_t)__return_storage_ptr__;
  if (totalTests == passedTests) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"allPassed",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else if (passedTests < totalTests * 3 >> 2) {
    if (passedTests < (totalTests << 1) >> 2) {
      if (passedTests < totalTests >> 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"fewPassed",&local_38);
        std::allocator<char>::~allocator(&local_38);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"somePassed",&local_37);
        std::allocator<char>::~allocator(&local_37);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"manyPassed",&local_36);
      std::allocator<char>::~allocator(&local_36);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"mostPassed",local_35);
    std::allocator<char>::~allocator(local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string getCssClass(const std::size_t totalTests, const std::size_t passedTests) {
  if (totalTests == passedTests) {
    return "allPassed";
  }
  if (passedTests >= ((totalTests * 3) / 4)) {
    return "mostPassed";
  }
  if (passedTests >= ((totalTests * 2) / 4)) {
    return "manyPassed";
  }
  if (passedTests >= ((totalTests * 1) / 4)) {
    return "somePassed";
  }
  return "fewPassed";
}